

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O0

void __thiscall Automaton::buildIncludesDigraph(Automaton *this)

{
  Include data;
  Include data_00;
  Include data_01;
  Include data_02;
  bool bVar1;
  _List_iterator<QString> *p_Var2;
  _List_iterator<std::_List_iterator<QString>_> __first;
  reference p_Var3;
  pointer pSVar4;
  iterator __last;
  NotNullable in_RDI;
  long in_FS_OFFSET;
  pair<std::_List_iterator<std::_Rb_tree_const_iterator<Node<Include>_>_>,_bool> pVar5;
  RulePointer *rule;
  iterator source;
  iterator target;
  iterator first_not_nullable;
  iterator source_1;
  iterator target_1;
  iterator dot;
  iterator A;
  StatePointer p;
  const_iterator it;
  pair<QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::const_iterator,_QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::const_iterator>
  range;
  Name name;
  iterator a;
  StatePointer pp;
  Include *in_stack_fffffffffffffe28;
  Name in_stack_fffffffffffffe30;
  StatePointer in_stack_fffffffffffffe38;
  Grammar *in_stack_fffffffffffffe40;
  Name in_stack_fffffffffffffe48;
  bool local_1a9;
  iterator in_stack_fffffffffffffe98;
  iterator in_stack_fffffffffffffea0;
  Name NVar6;
  _Self local_130;
  NotNullable local_128;
  _List_node_base *local_120;
  _Self local_118;
  _List_node_base *local_110;
  _List_iterator<State> local_108;
  _List_node_base *local_100;
  _Base_ptr local_f8;
  _List_node_base *local_f0;
  _List_node_base *local_e8;
  _Base_ptr local_d0;
  _List_node_base *local_c8;
  _List_node_base *local_c0;
  _Base_ptr local_a8;
  _Self local_a0;
  _List_node_base *local_98;
  _List_iterator<std::_List_iterator<QString>_> local_90;
  _Self local_88;
  _Self local_80;
  _List_node_base *local_78;
  const_iterator local_70;
  pair<QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::const_iterator,_QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::const_iterator>
  local_68;
  _List_node_base *local_58;
  _List_node_base *local_50;
  iterator local_48;
  iterator local_40;
  _Self local_38;
  _Self local_30;
  _List_node_base *local_28;
  undefined1 local_20;
  _List_node_base *local_18;
  undefined1 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<State,_std::allocator<State>_>::begin(in_stack_fffffffffffffe30._M_node);
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<State,_std::allocator<State>_>::end(in_stack_fffffffffffffe30._M_node);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    local_40._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    std::_List_iterator<State>::operator->((_List_iterator<State> *)0x12107b);
    local_40._M_node =
         (_Base_ptr)
         QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::begin
                   ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)
                    in_stack_fffffffffffffe40);
    while( true ) {
      std::_List_iterator<State>::operator->((_List_iterator<State> *)0x12109c);
      local_48._M_node =
           (_Base_ptr)
           QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::end
                     ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)
                      in_stack_fffffffffffffe40);
      bVar1 = ::operator!=((iterator *)in_stack_fffffffffffffe30._M_node,
                           (iterator *)in_stack_fffffffffffffe28);
      if (!bVar1) break;
      local_50 = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
      p_Var2 = QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::key
                         ((iterator *)0x1210ea);
      local_58 = p_Var2->_M_node;
      local_50 = local_58;
      bVar1 = Grammar::isNonTerminal
                        ((Grammar *)in_stack_fffffffffffffe30._M_node,in_stack_fffffffffffffe48);
      if (bVar1) {
        local_68.second.i._M_node = (const_iterator)(_Base_ptr)0xaaaaaaaaaaaaaaaa;
        local_68.first.i._M_node = (const_iterator)(_Base_ptr)0xaaaaaaaaaaaaaaaa;
        local_68 = QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::equal_range
                             ((QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_> *
                              )in_stack_fffffffffffffe48._M_node,
                              (_List_iterator<QString> *)in_stack_fffffffffffffe40);
        local_70 = local_68.first.i._M_node;
        while (bVar1 = ::operator!=((const_iterator *)in_stack_fffffffffffffe30._M_node,
                                    (const_iterator *)in_stack_fffffffffffffe28), bVar1) {
          __first._M_node =
               (_List_node_base *)
               QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::const_iterator::
               operator*((const_iterator *)0x1211cd);
          local_78 = local_30._M_node;
          local_80._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
          std::_List_iterator<Rule>::operator->((_List_iterator<Rule> *)0x12120a);
          local_80._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>::
               begin(in_stack_fffffffffffffe30._M_node);
          while( true ) {
            std::_List_iterator<Rule>::operator->((_List_iterator<Rule> *)0x121228);
            local_88._M_node =
                 (_List_node_base *)
                 std::__cxx11::
                 list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>
                 ::end(in_stack_fffffffffffffe30._M_node);
            bVar1 = std::operator!=(&local_80,&local_88);
            if (!bVar1) break;
            local_90._M_node = local_80._M_node;
            std::_List_iterator<std::_List_iterator<QString>_>::operator++(&local_90);
            in_stack_fffffffffffffe48._M_node = (_List_node_base *)(in_RDI._M_automaton)->_M_grammar
            ;
            p_Var3 = std::_List_iterator<std::_List_iterator<QString>_>::operator*
                               ((_List_iterator<std::_List_iterator<QString>_> *)0x1212a0);
            local_98 = p_Var3->_M_node;
            bVar1 = Grammar::isNonTerminal
                              ((Grammar *)in_stack_fffffffffffffe30._M_node,
                               in_stack_fffffffffffffe48);
            local_1a9 = false;
            if (bVar1) {
              std::_List_iterator<Rule>::operator->((_List_iterator<Rule> *)0x1212d6);
              local_a0._M_node =
                   (_List_node_base *)
                   std::__cxx11::
                   list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>
                   ::end(in_stack_fffffffffffffe30._M_node);
              local_1a9 = std::operator==(&local_90,&local_a0);
            }
            if (local_1a9 == false) {
              pSVar4 = std::_List_iterator<State>::operator->((_List_iterator<State> *)0x121438);
              in_stack_fffffffffffffe30._M_node = (_List_node_base *)&pSVar4->bundle;
              in_stack_fffffffffffffe38._M_node =
                   (_List_node_base *)
                   std::_List_iterator<std::_List_iterator<QString>_>::operator*
                             ((_List_iterator<std::_List_iterator<QString>_> *)0x12144e);
              std::_List_iterator<State>::_List_iterator(&local_108);
              local_100 = (_List_node_base *)
                          QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::value
                                    ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>
                                      *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38._M_node,
                                     in_stack_fffffffffffffe30._M_node);
              in_stack_fffffffffffffe40 = (in_RDI._M_automaton)->_M_grammar;
              local_78 = local_100;
              p_Var3 = std::_List_iterator<std::_List_iterator<QString>_>::operator*
                                 ((_List_iterator<std::_List_iterator<QString>_> *)0x1214ac);
              local_110 = p_Var3->_M_node;
              bVar1 = Grammar::isNonTerminal
                                ((Grammar *)in_stack_fffffffffffffe30._M_node,
                                 in_stack_fffffffffffffe48);
              if (bVar1) {
                local_118._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
                local_120 = local_90._M_node;
                std::_List_iterator<Rule>::operator->((_List_iterator<Rule> *)0x1214fb);
                __last = std::__cxx11::
                         list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>
                         ::end(in_stack_fffffffffffffe30._M_node);
                NotNullable::NotNullable(&local_128,in_RDI._M_automaton);
                local_118._M_node =
                     (_List_node_base *)
                     std::find_if<std::_List_iterator<std::_List_iterator<QString>>,NotNullable>
                               (__first,__last._M_node,in_RDI);
                std::_List_iterator<Rule>::operator->((_List_iterator<Rule> *)0x12154a);
                local_130._M_node =
                     (_List_node_base *)
                     std::__cxx11::
                     list<std::_List_iterator<QString>,_std::allocator<std::_List_iterator<QString>_>_>
                     ::end(in_stack_fffffffffffffe30._M_node);
                bVar1 = std::operator!=(&local_118,&local_130);
                if (!bVar1) {
                  Include::Include(in_stack_fffffffffffffe28,in_stack_fffffffffffffe38,
                                   in_stack_fffffffffffffe30);
                  data_01.nt._M_node = (_List_node_base *)in_stack_fffffffffffffea0._M_node;
                  data_01.state._M_node = (_List_node_base *)in_stack_fffffffffffffe98._M_node;
                  Node<Include>::get(data_01);
                  NVar6._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
                  std::_List_iterator<std::_List_iterator<QString>_>::operator*
                            ((_List_iterator<std::_List_iterator<QString>_> *)0x12160d);
                  Include::Include(in_stack_fffffffffffffe28,in_stack_fffffffffffffe38,
                                   in_stack_fffffffffffffe30);
                  data_02.nt._M_node = NVar6._M_node;
                  data_02.state._M_node = (_List_node_base *)in_stack_fffffffffffffe98._M_node;
                  in_stack_fffffffffffffea0 = Node<Include>::get(data_02);
                  std::_Rb_tree_const_iterator<Node<Include>_>::operator->
                            ((_Rb_tree_const_iterator<Node<Include>_> *)0x121647);
                  pVar5 = Node<Include>::insertEdge
                                    ((Node<Include> *)in_RDI._M_automaton,in_stack_fffffffffffffe98)
                  ;
                  local_28 = (_List_node_base *)pVar5.first._M_node;
                  local_20 = pVar5.second;
                }
              }
            }
            else {
              local_a8 = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
              local_c0 = local_30._M_node;
              local_c8 = local_50;
              Include::Include(in_stack_fffffffffffffe28,in_stack_fffffffffffffe38,
                               in_stack_fffffffffffffe30);
              data.nt._M_node = (_List_node_base *)in_stack_fffffffffffffea0._M_node;
              data.state._M_node = (_List_node_base *)in_stack_fffffffffffffe98._M_node;
              local_a8 = (_Base_ptr)Node<Include>::get(data);
              local_d0 = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
              local_e8 = local_78;
              p_Var3 = std::_List_iterator<std::_List_iterator<QString>_>::operator*
                                 ((_List_iterator<std::_List_iterator<QString>_> *)0x1213a5);
              local_f0 = p_Var3->_M_node;
              Include::Include(in_stack_fffffffffffffe28,in_stack_fffffffffffffe38,
                               in_stack_fffffffffffffe30);
              data_00.nt._M_node = (_List_node_base *)in_stack_fffffffffffffea0._M_node;
              data_00.state._M_node = (_List_node_base *)in_stack_fffffffffffffe98._M_node;
              local_d0 = (_Base_ptr)Node<Include>::get(data_00);
              std::_Rb_tree_const_iterator<Node<Include>_>::operator->
                        ((_Rb_tree_const_iterator<Node<Include>_> *)0x1213f7);
              local_f8 = local_a8;
              pVar5 = Node<Include>::insertEdge
                                ((Node<Include> *)in_RDI._M_automaton,in_stack_fffffffffffffe98);
              local_18 = (_List_node_base *)pVar5.first._M_node;
              local_10 = pVar5.second;
            }
            std::_List_iterator<std::_List_iterator<QString>_>::operator++(&local_80);
          }
          QMultiMap<std::_List_iterator<QString>,_std::_List_iterator<Rule>_>::const_iterator::
          operator++((const_iterator *)in_stack_fffffffffffffe30._M_node);
        }
      }
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::operator++
                ((iterator *)in_stack_fffffffffffffe30._M_node);
    }
    std::_List_iterator<State>::operator++(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Automaton::buildIncludesDigraph ()
{
  for (StatePointer pp = states.begin (); pp != states.end (); ++pp)
    {
      for (Bundle::iterator a = pp->bundle.begin (); a != pp->bundle.end (); ++a)
        {
          Name name = a.key ();

          if (! _M_grammar->isNonTerminal (name))
            continue;

          const auto range = std::as_const(_M_grammar->rule_map).equal_range(name);
          for (auto it = range.first; it != range.second; ++it)
            {
              const RulePointer &rule = *it;
              StatePointer p = pp;

              for (NameList::iterator A = rule->rhs.begin (); A != rule->rhs.end (); ++A)
                {
                  NameList::iterator dot = A;
                  ++dot;

                  if (_M_grammar->isNonTerminal (*A) && dot == rule->rhs.end ())
                    {
                      // found an include edge.
                      IncludesGraph::iterator target = IncludesGraph::get (Include (pp, name));
                      IncludesGraph::iterator source = IncludesGraph::get (Include (p, *A));

                      source->insertEdge (target);

#ifndef QLALR_NO_DEBUG_INCLUDES
                      qerr() << "*** (" << id (p) << ", " << *A << ") includes (" << id (pp) << ", " << *name << ")" << Qt::endl;
#endif // QLALR_NO_DEBUG_INCLUDES

                      continue;
                    }

                  p = p->bundle.value (*A);

                  if (! _M_grammar->isNonTerminal (*A))
                    continue;

                  NameList::iterator first_not_nullable = std::find_if(dot, rule->rhs.end(), NotNullable(this));
                  if (first_not_nullable != rule->rhs.end ())
                    continue;

                  // found an include edge.
                  IncludesGraph::iterator target = IncludesGraph::get (Include (pp, name));
                  IncludesGraph::iterator source = IncludesGraph::get (Include (p, *A));

                  source->insertEdge (target);

#ifndef QLALR_NO_DEBUG_INCLUDES
                  qerr() << "*** (" << id (p) << ", " << *A << ") includes (" << id (pp) << ", " << *name << ")" << Qt::endl;
#endif // QLALR_NO_DEBUG_INCLUDES
                }
            }
        }
    }
}